

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_hog.c
# Opt level: O2

void * HOG_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_ErrorCode errcode;
  PHYSFS_uint32 PVar1;
  int iVar2;
  int iVar3;
  void *opaque;
  void *pvVar4;
  ulong uVar5;
  PHYSFS_uint32 PVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  PHYSFS_uint8 buf [3];
  PHYSFS_uint32 numfiles;
  uint local_68;
  PHYSFS_uint32 size;
  uint local_60;
  PHYSFS_uint32 reserved;
  char name_1 [37];
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_hog.c"
                  ,0x76,"void *HOG_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar2 = __PHYSFS_readAll(io,buf,3);
    if (iVar2 == 0) {
      return (void *)0x0;
    }
    iVar2 = bcmp(buf,"DHF",3);
    if (iVar2 == 0) {
LAB_0010c7ec:
      *claimed = 1;
      opaque = UNPK_openArchive(io,0,1);
      if (opaque == (void *)0x0) {
        return (void *)0x0;
      }
      if (iVar2 == 0) {
        uVar5 = (*io->length)(io);
        uVar8 = 3;
        do {
          if (uVar5 <= uVar8) {
            return opaque;
          }
          iVar2 = __PHYSFS_readAll(io,name_1,0xd);
          if ((iVar2 == 0) || (iVar2 = readui32(io,&numfiles), PVar6 = numfiles, iVar2 == 0)) break;
          name_1[0xc] = '\0';
          uVar7 = (int)uVar8 + 0x11;
          pvVar4 = UNPK_addEntry(opaque,name_1,0,-1,-1,(ulong)uVar7,(ulong)numfiles);
          if (pvVar4 == (void *)0x0) break;
          uVar8 = (ulong)(PVar6 + uVar7);
          iVar2 = (*io->seek)(io,uVar8);
        } while (iVar2 != 0);
      }
      else {
        iVar2 = readui32(io,&numfiles);
        if (((iVar2 != 0) && (iVar2 = readui32(io,&local_60), iVar2 != 0)) &&
           (iVar2 = (*io->seek)(io,0x44), iVar2 != 0)) {
          PVar6 = numfiles;
          uVar7 = local_60;
          while( true ) {
            bVar9 = PVar6 == 0;
            PVar6 = PVar6 - 1;
            if (bVar9) {
              return opaque;
            }
            iVar2 = __PHYSFS_readAll(io,name_1,0x24);
            if (((iVar2 == 0) || (iVar2 = readui32(io,&reserved), iVar2 == 0)) ||
               ((iVar2 = readui32(io,&size), iVar2 == 0 ||
                (iVar2 = readui32(io,&local_68), PVar1 = size, iVar2 == 0)))) break;
            name_1[0x24] = '\0';
            pvVar4 = UNPK_addEntry(opaque,name_1,0,(ulong)local_68,(ulong)local_68,(ulong)uVar7,
                                   (ulong)size);
            if (pvVar4 == (void *)0x0) break;
            uVar7 = PVar1 + uVar7;
          }
        }
      }
      UNPK_abandonArchive(opaque);
      return (void *)0x0;
    }
    iVar3 = bcmp(buf,"HOG",3);
    if (iVar3 == 0) {
      iVar3 = __PHYSFS_readAll(io,buf,1);
      if (iVar3 == 0) {
        return (void *)0x0;
      }
      if (buf[0] == '2') goto LAB_0010c7ec;
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *HOG_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[3];
    void *unpkarc = NULL;
    int hog1 = 0;

    assert(io != NULL);  /* shouldn't ever happen. */
    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, 3), NULL);

    if (memcmp(buf, "DHF", 3) == 0)
        hog1 = 1;  /* original HOG (Descent 1 and 2) archive */
    else
    {
        BAIL_IF(memcmp(buf, "HOG", 3) != 0, PHYSFS_ERR_UNSUPPORTED, NULL); /* Not HOG2 */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, 1), NULL);
        BAIL_IF(buf[0] != '2', PHYSFS_ERR_UNSUPPORTED, NULL); /* Not HOG2 */
    } /* else */

    *claimed = 1;

    unpkarc = UNPK_openArchive(io, 0, 1);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!(hog1 ? hog1LoadEntries(io, unpkarc) : hog2LoadEntries(io, unpkarc)))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}